

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBlock::IfcBlock(IfcBlock *this)

{
  IfcBlock *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x60,"IfcBlock");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00fce718);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBlock,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBlock,_3UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00fce790);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfce660;
  *(undefined8 *)&this->field_0x60 = 0xfce700;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfce688;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfce6b0;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xfce6d8;
  return;
}

Assistant:

IfcBlock() : Object("IfcBlock") {}